

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

int Col_ListIterBegin(ColListIterator *it,Col_Word list,size_t index)

{
  size_t sVar1;
  size_t loop;
  size_t sStack_20;
  int looped;
  size_t index_local;
  Col_Word list_local;
  ColListIterator *it_local;
  
  loop._4_4_ = 0;
  it->list = list;
  sVar1 = Col_ListLength(list);
  it->length = sVar1;
  sStack_20 = index;
  if (it->length <= index) {
    sVar1 = Col_ListLoopLength(list);
    if (sVar1 != 0) {
      sStack_20 = (index - (it->length - sVar1)) % sVar1 + (it->length - sVar1);
    }
    else {
      sStack_20 = it->length;
    }
    loop._4_4_ = (uint)(sVar1 != 0);
  }
  it->index = sStack_20;
  (it->chunk).first = 0xffffffffffffffff;
  return loop._4_4_;
}

Assistant:

int
Col_ListIterBegin(
    Col_ListIterator it,    /*!< Iterator to initialize. */
    Col_Word list,          /*!< List to iterate over. */
    size_t index)           /*!< Index of first element to iterate. */
{
    int looped=0;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_LIST,list} */
    TYPECHECK_LIST(list) {
        Col_ListIterSetNull(it);
        return 0;
    }

    it->list = list;
    it->length = Col_ListLength(list);
    if (index >= it->length) {
        size_t loop = Col_ListLoopLength(list);
        if (!loop) {
            /*
             * End of list.
             */

            index = it->length;
        } else {
            /*
             * Cyclic list. Normalize index.
             */

            looped = 1;
            index = (index - (it->length-loop)) % loop + (it->length-loop);
        }
    }
    it->index = index;

    /*
     * Traversal info will be lazily computed.
     */

    it->chunk.first = SIZE_MAX;

    return looped;
}